

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::RenderingInfoWrapper::RenderingInfoWrapper
          (RenderingInfoWrapper *this,size_t Hash,uint32_t ColorAttachmentCount,
          bool UseDepthAttachment,bool UseStencilAttachment)

{
  _Alloc_hider __p;
  VkRenderingAttachmentInfo *pVVar1;
  undefined7 in_register_00000009;
  VkRenderingAttachmentInfo *Args_1;
  long lVar2;
  uint uVar3;
  undefined7 in_register_00000081;
  ulong uVar4;
  string msg;
  
  uVar4 = CONCAT71(in_register_00000081,UseStencilAttachment);
  Args_1 = (VkRenderingAttachmentInfo *)CONCAT71(in_register_00000009,UseDepthAttachment);
  *(undefined8 *)&this->m_RI = 0;
  (this->m_RI).pNext = (void *)0x0;
  (this->m_RI).flags = 0;
  (this->m_RI).renderArea.offset.x = 0;
  *(undefined8 *)&(this->m_RI).renderArea.offset.y = 0;
  *(undefined8 *)&(this->m_RI).renderArea.extent.height = 0;
  (this->m_RI).viewMask = 0;
  (this->m_RI).colorAttachmentCount = 0;
  (this->m_RI).pColorAttachments = (VkRenderingAttachmentInfo *)0x0;
  (this->m_RI).pDepthAttachment = (VkRenderingAttachmentInfo *)0x0;
  (this->m_RI).pStencilAttachment = (VkRenderingAttachmentInfo *)0x0;
  this->m_Hash = Hash;
  (this->m_Attachments)._M_t.
  super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl =
       (VkRenderingAttachmentInfo *)0x0;
  (this->m_ShadingRateAttachment)._M_t.
  super___uniq_ptr_impl<VkRenderingFragmentShadingRateAttachmentInfoKHR,_std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingFragmentShadingRateAttachmentInfoKHR_*,_std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>_>
  .super__Head_base<0UL,_VkRenderingFragmentShadingRateAttachmentInfoKHR_*,_false>._M_head_impl =
       (VkRenderingFragmentShadingRateAttachmentInfoKHR *)0x0;
  this->m_DepthAttachmentIndex = 0xffffffff;
  this->m_StencilAttachmentIndex = 0xffffffff;
  this->m_AttachmentClearMask = 0;
  (this->m_RI).sType = VK_STRUCTURE_TYPE_RENDERING_INFO;
  (this->m_RI).flags = 0;
  (this->m_RI).colorAttachmentCount = ColorAttachmentCount;
  uVar3 = (int)Args_1 + ColorAttachmentCount + (int)uVar4;
  if (uVar3 == 0) {
    pVVar1 = (VkRenderingAttachmentInfo *)0x0;
  }
  else {
    std::make_unique<VkRenderingAttachmentInfo[]>((size_t)&msg);
    __p = msg._M_dataplus;
    msg._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>::
    reset((__uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
           *)&this->m_Attachments,(pointer)__p._M_p);
    std::unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
    ::~unique_ptr((unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
                   *)&msg);
    pVVar1 = (this->m_Attachments)._M_t.
             super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
             .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl;
    uVar4 = uVar4 & 0xffffffff;
    for (lVar2 = 0; (ulong)uVar3 * 0x48 - lVar2 != 0; lVar2 = lVar2 + 0x48) {
      *(undefined4 *)((long)&pVVar1->sType + lVar2) = 0x3b9b75e1;
    }
  }
  if (ColorAttachmentCount != 0) {
    (this->m_RI).pColorAttachments = pVVar1;
  }
  if (UseDepthAttachment) {
    this->m_DepthAttachmentIndex = ColorAttachmentCount;
    Args_1 = pVVar1 + ColorAttachmentCount;
    (this->m_RI).pDepthAttachment = Args_1;
    ColorAttachmentCount = ColorAttachmentCount + 1;
  }
  if ((char)uVar4 != '\0') {
    this->m_StencilAttachmentIndex = ColorAttachmentCount;
    Args_1 = (VkRenderingAttachmentInfo *)((ulong)ColorAttachmentCount * 0x48);
    (this->m_RI).pStencilAttachment = pVVar1 + ColorAttachmentCount;
    ColorAttachmentCount = ColorAttachmentCount + 1;
  }
  if (ColorAttachmentCount != uVar3) {
    Diligent::FormatString<char[26],char[38]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AttachmentInd == TotalAttachmentCount",(char (*) [38])Args_1);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"RenderingInfoWrapper",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
               ,0x48);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

RenderingInfoWrapper::RenderingInfoWrapper(size_t   Hash,
                                           uint32_t ColorAttachmentCount,
                                           bool     UseDepthAttachment,
                                           bool     UseStencilAttachment) :
    m_RI{},
    m_Hash{Hash}
{
    m_RI.sType                = VK_STRUCTURE_TYPE_RENDERING_INFO_KHR;
    m_RI.pNext                = nullptr;
    m_RI.flags                = 0;
    m_RI.colorAttachmentCount = ColorAttachmentCount;

    const uint32_t TotalAttachmentCount = ColorAttachmentCount + (UseDepthAttachment ? 1u : 0u) + (UseStencilAttachment ? 1u : 0u);
    if (TotalAttachmentCount > 0)
    {
        m_Attachments = std::make_unique<VkRenderingAttachmentInfo[]>(TotalAttachmentCount);
        for (size_t i = 0; i < TotalAttachmentCount; ++i)
            m_Attachments[i].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO_KHR;
    }
    uint32_t AttachmentInd = 0;
    if (ColorAttachmentCount > 0)
    {
        m_RI.pColorAttachments = &m_Attachments[AttachmentInd];
        AttachmentInd += ColorAttachmentCount;
    }
    if (UseDepthAttachment)
    {
        m_DepthAttachmentIndex = AttachmentInd;
        m_RI.pDepthAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    if (UseStencilAttachment)
    {
        m_StencilAttachmentIndex = AttachmentInd;
        m_RI.pStencilAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    VERIFY_EXPR(AttachmentInd == TotalAttachmentCount);
}